

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O2

BinaryOperator * LLVMBC::dyn_cast<LLVMBC::BinaryOperator>(Value *value)

{
  ValueKind VVar1;
  BinaryOperator *this;
  BinaryOperator *pBVar2;
  
  if (value != (Value *)0x0) {
    this = (BinaryOperator *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)this);
    pBVar2 = (BinaryOperator *)0x0;
    if (VVar1 == BinaryOperator) {
      pBVar2 = this;
    }
    return pBVar2;
  }
  return (BinaryOperator *)0x0;
}

Assistant:

inline T *dyn_cast(Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<T *>(value);
	else
		return nullptr;
}